

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp_x86::forward
          (BinaryOp_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  int iVar2;
  uint uVar3;
  uint _elempack;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Option *pOVar10;
  int iVar11;
  size_t sVar12;
  ulong uVar13;
  Mat *b;
  int iVar14;
  Mat *pMVar15;
  Option *opt_00;
  Option *_elemsize;
  bool bVar16;
  Mat local_110;
  Mat local_c8;
  Mat local_80;
  BinaryOp_x86 *local_38;
  
  pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar11 = pMVar1->dims;
  local_c8.dims = pMVar1[1].dims;
  iVar2 = local_c8.dims;
  if (local_c8.dims < iVar11) {
    iVar2 = iVar11;
  }
  local_80.data = pMVar1->data;
  local_80.refcount = pMVar1->refcount;
  local_80.elemsize = pMVar1->elemsize;
  local_80.elempack = pMVar1->elempack;
  local_80.allocator = pMVar1->allocator;
  local_80.h = pMVar1->h;
  local_80.d = pMVar1->d;
  local_80.w = pMVar1->w;
  local_80.dims = iVar11;
  local_80.c = pMVar1->c;
  local_80.cstep = pMVar1->cstep;
  if (local_80.refcount != (int *)0x0) {
    LOCK();
    *local_80.refcount = *local_80.refcount + 1;
    UNLOCK();
    local_c8.dims = pMVar1[1].dims;
  }
  local_c8.data = pMVar1[1].data;
  local_c8.refcount = pMVar1[1].refcount;
  local_c8.elemsize = pMVar1[1].elemsize;
  local_c8.elempack = pMVar1[1].elempack;
  local_c8.allocator = pMVar1[1].allocator;
  uVar4 = pMVar1[1].w;
  uVar5 = pMVar1[1].h;
  uVar6 = pMVar1[1].d;
  uVar7 = pMVar1[1].c;
  local_c8.cstep = pMVar1[1].cstep;
  if (local_c8.refcount != (int *)0x0) {
    LOCK();
    *local_c8.refcount = *local_c8.refcount + 1;
    UNLOCK();
  }
  pMVar15 = pMVar1 + 1;
  local_c8.w = uVar4;
  local_c8.h = uVar5;
  local_c8.d = uVar6;
  local_c8.c = uVar7;
  local_38 = this;
  if (pMVar1->dims < iVar2) {
    if (iVar2 == 2) {
      sVar12 = (long)pMVar1->elempack * (long)pMVar1->w;
      iVar11 = (int)sVar12;
      if (iVar11 == pMVar1[1].elempack * pMVar1[1].h) {
        Mat::reshape(&local_110,pMVar1,1,pMVar1->w,opt->workspace_allocator);
        if (local_110.refcount != (int *)0x0) {
          LOCK();
          *local_110.refcount = *local_110.refcount + 1;
          UNLOCK();
        }
        if (local_80.refcount != (int *)0x0) {
          LOCK();
          *local_80.refcount = *local_80.refcount + -1;
          UNLOCK();
          if (*local_80.refcount == 0) {
            if (local_80.allocator == (Allocator *)0x0) {
              free(local_80.data);
            }
            else {
              (*(local_80.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_80.data = local_110.data;
        local_80.refcount = local_110.refcount;
        local_80.elemsize = local_110.elemsize;
        local_80.elempack = local_110.elempack;
        local_80.allocator = local_110.allocator;
        local_80.dims = local_110.dims;
        local_80.w = local_110.w;
        local_80.h = local_110.h;
        local_80.d = local_110.d;
        local_80.c = local_110.c;
        local_80.cstep = local_110.cstep;
        if (local_110.refcount != (int *)0x0) {
          LOCK();
          *local_110.refcount = *local_110.refcount + -1;
          UNLOCK();
          if (*local_110.refcount == 0) {
            if (local_110.allocator == (Allocator *)0x0) {
              free(local_110.data);
            }
            else {
              (*(local_110.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        local_80.w = iVar11;
        local_80.dims = 2;
        local_80.elempack = 1;
        local_80.elemsize = pMVar1->elemsize / (ulong)(long)pMVar1->elempack;
        local_80.cstep = sVar12;
      }
    }
    if ((iVar2 == 3) && (pMVar1->dims == 1)) {
      sVar12 = (long)pMVar1->elempack * (long)pMVar1->w;
      iVar11 = (int)sVar12;
      if (iVar11 == pMVar1[1].elempack * pMVar1[1].c) {
        Mat::reshape(&local_110,pMVar1,1,1,pMVar1->w,opt->workspace_allocator);
        if (local_110.refcount != (int *)0x0) {
          LOCK();
          *local_110.refcount = *local_110.refcount + 1;
          UNLOCK();
        }
        if (local_80.refcount != (int *)0x0) {
          LOCK();
          *local_80.refcount = *local_80.refcount + -1;
          UNLOCK();
          if (*local_80.refcount == 0) {
            if (local_80.allocator == (Allocator *)0x0) {
              free(local_80.data);
            }
            else {
              (*(local_80.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_80.data = local_110.data;
        local_80.refcount = local_110.refcount;
        local_80.elemsize = local_110.elemsize;
        local_80.elempack = local_110.elempack;
        local_80.allocator = local_110.allocator;
        local_80.dims = local_110.dims;
        local_80.w = local_110.w;
        local_80.h = local_110.h;
        local_80.d = local_110.d;
        local_80.c = local_110.c;
        local_80.cstep = local_110.cstep;
        if (local_110.refcount != (int *)0x0) {
          LOCK();
          *local_110.refcount = *local_110.refcount + -1;
          UNLOCK();
          if (*local_110.refcount == 0) {
            if (local_110.allocator == (Allocator *)0x0) {
              free(local_110.data);
            }
            else {
              (*(local_110.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        local_80.w = iVar11;
        local_80.dims = 3;
        local_80.elempack = 1;
        local_80.elemsize = pMVar1->elemsize / (ulong)(long)pMVar1->elempack;
        local_80.cstep = sVar12;
      }
    }
    if (pMVar1->dims == 2 && iVar2 == 3) {
      Mat::reshape(&local_110,pMVar1,1,pMVar1->w,pMVar1->h,opt->workspace_allocator);
      if (local_110.refcount != (int *)0x0) {
        LOCK();
        *local_110.refcount = *local_110.refcount + 1;
        UNLOCK();
      }
      if (local_80.refcount != (int *)0x0) {
        LOCK();
        *local_80.refcount = *local_80.refcount + -1;
        UNLOCK();
        if (*local_80.refcount == 0) {
          if (local_80.allocator == (Allocator *)0x0) {
            free(local_80.data);
          }
          else {
            (*(local_80.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_80.data = local_110.data;
      local_80.refcount = local_110.refcount;
      local_80.elemsize = local_110.elemsize;
      local_80.elempack = local_110.elempack;
      local_80.allocator = local_110.allocator;
      local_80.dims = local_110.dims;
      local_80.w = local_110.w;
      local_80.h = local_110.h;
      local_80.d = local_110.d;
      local_80.c = local_110.c;
      local_80.cstep = local_110.cstep;
      if (local_110.refcount != (int *)0x0) {
        LOCK();
        *local_110.refcount = *local_110.refcount + -1;
        UNLOCK();
        if (*local_110.refcount == 0) {
          if (local_110.allocator == (Allocator *)0x0) {
            free(local_110.data);
          }
          else {
            (*(local_110.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      bVar16 = false;
      uVar8 = local_80._40_8_;
      uVar9 = local_80._48_8_;
    }
    else {
      bVar16 = iVar2 == 4;
      uVar8 = local_80._40_8_;
      uVar9 = local_80._48_8_;
      if (pMVar1->dims == 1 && bVar16) {
        sVar12 = (long)pMVar1->elempack * (long)pMVar1->w;
        iVar11 = (int)sVar12;
        if (iVar11 == pMVar1[1].elempack * pMVar1[1].c) {
          Mat::reshape(&local_110,pMVar1,1,1,1,pMVar1->w,opt->workspace_allocator);
          if (local_110.refcount != (int *)0x0) {
            LOCK();
            *local_110.refcount = *local_110.refcount + 1;
            UNLOCK();
          }
          if (local_80.refcount != (int *)0x0) {
            LOCK();
            *local_80.refcount = *local_80.refcount + -1;
            UNLOCK();
            if (*local_80.refcount == 0) {
              if (local_80.allocator == (Allocator *)0x0) {
                free(local_80.data);
              }
              else {
                (*(local_80.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_80.data = local_110.data;
          local_80.refcount = local_110.refcount;
          local_80.elemsize = local_110.elemsize;
          local_80.elempack = local_110.elempack;
          local_80.allocator = local_110.allocator;
          uVar8._0_4_ = local_110.dims;
          uVar8._4_4_ = local_110.w;
          uVar9._0_4_ = local_110.h;
          uVar9._4_4_ = local_110.d;
          local_80.dims = local_110.dims;
          local_80.w = local_110.w;
          local_80.h = local_110.h;
          local_80.d = local_110.d;
          local_80.c = local_110.c;
          local_80.cstep = local_110.cstep;
          if (local_110.refcount != (int *)0x0) {
            LOCK();
            *local_110.refcount = *local_110.refcount + -1;
            UNLOCK();
            uVar8 = local_80._40_8_;
            uVar9 = local_80._48_8_;
            if (*local_110.refcount == 0) {
              if (local_110.allocator == (Allocator *)0x0) {
                free(local_110.data);
                uVar8 = local_80._40_8_;
                uVar9 = local_80._48_8_;
              }
              else {
                (*(local_110.allocator)->_vptr_Allocator[3])();
                uVar8 = local_80._40_8_;
                uVar9 = local_80._48_8_;
              }
            }
          }
        }
        else {
          local_80.w = iVar11;
          local_80.dims = 4;
          local_80.elempack = 1;
          local_80.elemsize = pMVar1->elemsize / (ulong)(long)pMVar1->elempack;
          uVar8 = local_80._40_8_;
          local_80.cstep = sVar12;
        }
      }
    }
    local_80._48_8_ = uVar9;
    local_80._40_8_ = uVar8;
    iVar11 = pMVar1->dims;
    if ((bool)(iVar11 == 2 & bVar16)) {
      Mat::reshape(&local_110,pMVar1,1,1,pMVar1->w,pMVar1->h,opt->workspace_allocator);
      if (local_110.refcount != (int *)0x0) {
        LOCK();
        *local_110.refcount = *local_110.refcount + 1;
        UNLOCK();
      }
      if (local_80.refcount != (int *)0x0) {
        LOCK();
        *local_80.refcount = *local_80.refcount + -1;
        UNLOCK();
        if (*local_80.refcount == 0) {
          if (local_80.allocator == (Allocator *)0x0) {
            free(local_80.data);
          }
          else {
            (*(local_80.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_80.data = local_110.data;
      local_80.refcount = local_110.refcount;
      local_80.elemsize = local_110.elemsize;
      local_80.elempack = local_110.elempack;
      local_80.allocator = local_110.allocator;
      local_80.dims = local_110.dims;
      local_80.w = local_110.w;
      local_80.h = local_110.h;
      local_80.d = local_110.d;
      local_80.c = local_110.c;
      local_80.cstep = local_110.cstep;
      if (local_110.refcount != (int *)0x0) {
        LOCK();
        *local_110.refcount = *local_110.refcount + -1;
        UNLOCK();
        if (*local_110.refcount == 0) {
          if (local_110.allocator == (Allocator *)0x0) {
            free(local_110.data);
          }
          else {
            (*(local_110.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar11 = pMVar1->dims;
    }
    if (!(bool)(bVar16 & iVar11 == 3)) goto LAB_0035ffc8;
    Mat::reshape(&local_110,pMVar1,1,pMVar1->w,pMVar1->h,pMVar1->c,opt->workspace_allocator);
    if (local_110.refcount != (int *)0x0) {
      LOCK();
      *local_110.refcount = *local_110.refcount + 1;
      UNLOCK();
    }
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + -1;
      UNLOCK();
      if (*local_80.refcount == 0) {
        if (local_80.allocator == (Allocator *)0x0) {
          free(local_80.data);
        }
        else {
          (*(local_80.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_80.data = local_110.data;
    local_80.refcount = local_110.refcount;
    local_80.elemsize = local_110.elemsize;
    local_80.elempack = local_110.elempack;
    local_80.allocator = local_110.allocator;
    local_80.dims = local_110.dims;
    local_80.w = local_110.w;
    local_80.h = local_110.h;
    local_80.d = local_110.d;
    local_80.c = local_110.c;
    local_80.cstep = local_110.cstep;
    if (local_110.refcount != (int *)0x0) {
      LOCK();
      *local_110.refcount = *local_110.refcount + -1;
      UNLOCK();
      if (*local_110.refcount == 0) {
        if (local_110.allocator == (Allocator *)0x0) {
          free(local_110.data);
        }
        else {
          (*(local_110.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar11 = pMVar1[1].dims;
    if (3 < iVar11) goto LAB_00360729;
LAB_00360132:
    bVar16 = iVar2 == 3;
    if (iVar11 == 1 && iVar2 == 3) {
      uVar13 = (ulong)pMVar1[1].elempack;
      sVar12 = uVar13 * (long)pMVar1[1].w;
      if ((int)sVar12 == pMVar1->elempack * pMVar1->c) {
        Mat::reshape(&local_110,pMVar15,1,1,pMVar1[1].w,opt->workspace_allocator);
        if (local_110.refcount != (int *)0x0) {
          LOCK();
          *local_110.refcount = *local_110.refcount + 1;
          UNLOCK();
        }
        if (local_c8.refcount != (int *)0x0) {
          LOCK();
          *local_c8.refcount = *local_c8.refcount + -1;
          UNLOCK();
          if (*local_c8.refcount == 0) {
            if (local_c8.allocator == (Allocator *)0x0) {
              free(local_c8.data);
            }
            else {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_c8.data = local_110.data;
        local_c8.refcount = local_110.refcount;
        local_c8.elemsize = local_110.elemsize;
        local_c8.elempack = local_110.elempack;
        local_c8.allocator = local_110.allocator;
        local_c8.dims = local_110.dims;
        local_c8.w = local_110.w;
        local_c8.h = local_110.h;
        local_c8.d = local_110.d;
        local_c8.c = local_110.c;
        local_c8.cstep = local_110.cstep;
        if (local_110.refcount != (int *)0x0) {
          LOCK();
          *local_110.refcount = *local_110.refcount + -1;
          UNLOCK();
          if (*local_110.refcount == 0) {
            if (local_110.allocator == (Allocator *)0x0) {
              free(local_110.data);
            }
            else {
              (*(local_110.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar11 = pMVar1[1].dims;
        goto LAB_003602f8;
      }
      local_c8.dims = 3;
LAB_0036047b:
      local_c8.w = (int)sVar12;
      local_c8.elempack = 1;
      local_c8.elemsize = pMVar1[1].elemsize / uVar13;
      local_c8.cstep = sVar12;
    }
    else {
LAB_003602f8:
      if ((bVar16) && (iVar11 == 2)) {
        Mat::reshape(&local_110,pMVar15,1,pMVar1[1].w,pMVar1[1].h,opt->workspace_allocator);
        if (local_110.refcount != (int *)0x0) {
          LOCK();
          *local_110.refcount = *local_110.refcount + 1;
          UNLOCK();
        }
        if (local_c8.refcount != (int *)0x0) {
          LOCK();
          *local_c8.refcount = *local_c8.refcount + -1;
          UNLOCK();
          if (*local_c8.refcount == 0) {
            if (local_c8.allocator == (Allocator *)0x0) {
              free(local_c8.data);
            }
            else {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_c8.data = local_110.data;
        local_c8.refcount = local_110.refcount;
        local_c8.elemsize = local_110.elemsize;
        local_c8.elempack = local_110.elempack;
        local_c8.allocator = local_110.allocator;
        local_c8.dims = local_110.dims;
        local_c8.w = local_110.w;
        local_c8.h = local_110.h;
        local_c8.d = local_110.d;
        local_c8.c = local_110.c;
        local_c8.cstep = local_110.cstep;
        if (local_110.refcount != (int *)0x0) {
          LOCK();
          *local_110.refcount = *local_110.refcount + -1;
          UNLOCK();
          if (*local_110.refcount == 0) {
            if (local_110.allocator == (Allocator *)0x0) {
              free(local_110.data);
            }
            else {
              (*(local_110.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar11 = pMVar1[1].dims;
      }
      if ((iVar2 == 4) && (iVar11 == 1)) {
        uVar13 = (ulong)pMVar1[1].elempack;
        sVar12 = uVar13 * (long)pMVar1[1].w;
        if ((int)sVar12 != pMVar1->elempack * pMVar1->c) {
          local_c8.dims = 4;
          goto LAB_0036047b;
        }
        Mat::reshape(&local_110,pMVar15,1,1,1,pMVar1[1].w,opt->workspace_allocator);
        if (local_110.refcount != (int *)0x0) {
          LOCK();
          *local_110.refcount = *local_110.refcount + 1;
          UNLOCK();
        }
        if (local_c8.refcount != (int *)0x0) {
          LOCK();
          *local_c8.refcount = *local_c8.refcount + -1;
          UNLOCK();
          if (*local_c8.refcount == 0) {
            if (local_c8.allocator == (Allocator *)0x0) {
              free(local_c8.data);
            }
            else {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_c8.data = local_110.data;
        local_c8.refcount = local_110.refcount;
        local_c8.elemsize = local_110.elemsize;
        local_c8.elempack = local_110.elempack;
        local_c8.allocator = local_110.allocator;
        local_c8.dims = local_110.dims;
        local_c8.w = local_110.w;
        local_c8.h = local_110.h;
        local_c8.d = local_110.d;
        local_c8.c = local_110.c;
        local_c8.cstep = local_110.cstep;
        if (local_110.refcount != (int *)0x0) {
          LOCK();
          *local_110.refcount = *local_110.refcount + -1;
          UNLOCK();
          if (*local_110.refcount == 0) {
            if (local_110.allocator == (Allocator *)0x0) {
              free(local_110.data);
            }
            else {
              (*(local_110.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar11 = pMVar1[1].dims;
      }
      if ((iVar2 == 4) && (iVar11 == 2)) {
        Mat::reshape(&local_110,pMVar15,1,1,pMVar1[1].w,pMVar1[1].h,opt->workspace_allocator);
        if (local_110.refcount != (int *)0x0) {
          LOCK();
          *local_110.refcount = *local_110.refcount + 1;
          UNLOCK();
        }
        if (local_c8.refcount != (int *)0x0) {
          LOCK();
          *local_c8.refcount = *local_c8.refcount + -1;
          UNLOCK();
          if (*local_c8.refcount == 0) {
            if (local_c8.allocator == (Allocator *)0x0) {
              free(local_c8.data);
            }
            else {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_c8.data = local_110.data;
        local_c8.refcount = local_110.refcount;
        local_c8.elemsize = local_110.elemsize;
        local_c8.elempack = local_110.elempack;
        local_c8.allocator = local_110.allocator;
        local_c8.dims = local_110.dims;
        local_c8.w = local_110.w;
        local_c8.h = local_110.h;
        local_c8.d = local_110.d;
        local_c8.c = local_110.c;
        local_c8.cstep = local_110.cstep;
        if (local_110.refcount != (int *)0x0) {
          LOCK();
          *local_110.refcount = *local_110.refcount + -1;
          UNLOCK();
          if (*local_110.refcount == 0) {
            if (local_110.allocator == (Allocator *)0x0) {
              free(local_110.data);
            }
            else {
              (*(local_110.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar11 = pMVar1[1].dims;
      }
      if ((iVar2 == 4) && (iVar11 == 3)) {
        Mat::reshape(&local_110,pMVar15,1,pMVar1[1].w,pMVar1[1].h,pMVar1[1].c,
                     opt->workspace_allocator);
        if (local_110.refcount != (int *)0x0) {
          LOCK();
          *local_110.refcount = *local_110.refcount + 1;
          UNLOCK();
        }
        if (local_c8.refcount != (int *)0x0) {
          LOCK();
          *local_c8.refcount = *local_c8.refcount + -1;
          UNLOCK();
          if (*local_c8.refcount == 0) {
            if (local_c8.allocator == (Allocator *)0x0) {
              free(local_c8.data);
            }
            else {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_c8.data = local_110.data;
        local_c8.refcount = local_110.refcount;
        local_c8.elemsize = local_110.elemsize;
        local_c8.elempack = local_110.elempack;
        local_c8.allocator = local_110.allocator;
        local_c8.dims = local_110.dims;
        local_c8.w = local_110.w;
        local_c8.h = local_110.h;
        local_c8.d = local_110.d;
        local_c8.c = local_110.c;
        local_c8.cstep = local_110.cstep;
        if (local_110.refcount != (int *)0x0) {
          LOCK();
          *local_110.refcount = *local_110.refcount + -1;
          UNLOCK();
          if (*local_110.refcount == 0) {
            if (local_110.allocator == (Allocator *)0x0) {
              free(local_110.data);
            }
            else {
              (*(local_110.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
  }
  else {
LAB_0035ffc8:
    iVar11 = pMVar1[1].dims;
    if (iVar11 < iVar2) {
      if (iVar2 != 2) goto LAB_00360132;
      sVar12 = (long)pMVar1[1].elempack * (long)pMVar1[1].w;
      iVar14 = (int)sVar12;
      if (iVar14 == pMVar1->elempack * pMVar1->h) {
        Mat::reshape(&local_110,pMVar15,1,pMVar1[1].w,opt->workspace_allocator);
        if (local_110.refcount != (int *)0x0) {
          LOCK();
          *local_110.refcount = *local_110.refcount + 1;
          UNLOCK();
        }
        if (local_c8.refcount != (int *)0x0) {
          LOCK();
          *local_c8.refcount = *local_c8.refcount + -1;
          UNLOCK();
          if (*local_c8.refcount == 0) {
            if (local_c8.allocator == (Allocator *)0x0) {
              free(local_c8.data);
            }
            else {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_c8.data = local_110.data;
        local_c8.refcount = local_110.refcount;
        local_c8.elemsize = local_110.elemsize;
        local_c8.elempack = local_110.elempack;
        local_c8.allocator = local_110.allocator;
        local_c8.dims = local_110.dims;
        local_c8.w = local_110.w;
        local_c8.h = local_110.h;
        local_c8.d = local_110.d;
        local_c8.c = local_110.c;
        local_c8.cstep = local_110.cstep;
        if (local_110.refcount != (int *)0x0) {
          LOCK();
          *local_110.refcount = *local_110.refcount + -1;
          UNLOCK();
          if (*local_110.refcount == 0) {
            if (local_110.allocator == (Allocator *)0x0) {
              free(local_110.data);
            }
            else {
              (*(local_110.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar11 = pMVar1[1].dims;
        bVar16 = false;
      }
      else {
        local_c8.dims = 2;
        local_c8.elempack = 1;
        bVar16 = false;
        local_c8.elemsize = pMVar1[1].elemsize / (ulong)(long)pMVar1[1].elempack;
        local_c8.w = iVar14;
        local_c8.cstep = sVar12;
      }
      goto LAB_003602f8;
    }
  }
LAB_00360729:
  iVar11 = local_c8.w;
  if (local_c8.w < local_80.w) {
    iVar11 = local_80.w;
  }
  iVar14 = local_c8.h;
  if (local_c8.h < local_80.h) {
    iVar14 = local_80.h;
  }
  uVar3 = local_c8.c;
  if (local_c8.c < local_80.c) {
    uVar3 = local_80.c;
  }
  opt_00 = (Option *)(ulong)uVar3;
  _elemsize = (Option *)local_c8.elemsize;
  if (local_c8.elemsize < local_80.elemsize) {
    _elemsize = (Option *)local_80.elemsize;
  }
  _elempack = local_c8.elempack;
  if (local_c8.elempack < local_80.elempack) {
    _elempack = local_80.elempack;
  }
  pOVar10 = (Option *)(ulong)_elempack;
  pMVar1 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  switch(iVar2) {
  case 1:
    opt_00 = (Option *)opt->blob_allocator;
    Mat::create(pMVar1,iVar11,(size_t)_elemsize,_elempack,(Allocator *)opt_00);
    break;
  case 2:
    Mat::create(pMVar1,iVar11,iVar14,(size_t)_elemsize,_elempack,opt->blob_allocator);
    opt_00 = pOVar10;
    break;
  case 3:
    Mat::create(pMVar1,iVar11,iVar14,uVar3,(size_t)_elemsize,_elempack,opt->blob_allocator);
    opt_00 = _elemsize;
    break;
  case 4:
    iVar2 = local_c8.d;
    if (local_c8.d < local_80.d) {
      iVar2 = local_80.d;
    }
    Mat::create(pMVar1,iVar11,iVar14,iVar2,uVar3,(size_t)_elemsize,_elempack,opt->blob_allocator);
  }
  iVar11 = -100;
  if ((pMVar1->data == (void *)0x0) || ((long)pMVar1->c * pMVar1->cstep == 0)) goto LAB_003608ea;
  if (local_80.elempack < local_c8.elempack) {
LAB_00360887:
    iVar11 = (local_38->super_BinaryOp).op_type;
    uVar3 = iVar11 - 1;
    if ((uVar3 < 0xb) && ((0x7e5U >> (uVar3 & 0x1f) & 1) != 0)) {
      iVar11 = *(int *)(&DAT_0053f6b0 + (ulong)uVar3 * 4);
    }
    pMVar15 = &local_c8;
    b = &local_80;
  }
  else {
    if (local_80.elempack == local_c8.elempack) {
      if (local_80.elempack * local_80.w * local_80.h * local_80.d * local_80.c <
          local_c8.elempack * local_c8.w * local_c8.h * local_c8.d * local_c8.c) goto LAB_00360887;
    }
    iVar11 = (local_38->super_BinaryOp).op_type;
    pMVar15 = &local_80;
    b = &local_c8;
  }
  binary_op_broadcast(pMVar15,b,pMVar1,iVar11,opt_00);
  iVar11 = 0;
LAB_003608ea:
  if (local_c8.refcount != (int *)0x0) {
    LOCK();
    *local_c8.refcount = *local_c8.refcount + -1;
    UNLOCK();
    if (*local_c8.refcount == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        free(local_c8.data);
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_80.refcount != (int *)0x0) {
    LOCK();
    *local_80.refcount = *local_80.refcount + -1;
    UNLOCK();
    if (*local_80.refcount == 0) {
      if (local_80.allocator == (Allocator *)0x0) {
        free(local_80.data);
      }
      else {
        (*(local_80.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar11;
}

Assistant:

int BinaryOp_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A = bottom_blobs[0];
    const Mat& B = bottom_blobs[1];
    const int outdims = std::max(A.dims, B.dims);

    Mat A2 = A;
    Mat B2 = B;
    if (A.dims < outdims)
    {
        // expand inner axes
        if (outdims == 2)
        {
            if (A.w * A.elempack == B.h * B.elempack)
                A2 = A.reshape(1, A.w, opt.workspace_allocator);
            else // if (A.w == B.w)
            {
                A2.dims = 2;
                A2.w = A.w * A.elempack;
                A2.elempack = 1;
                A2.elemsize = A.elemsize / A.elempack;
                A2.cstep = A2.w;
            }
        }
        if (outdims == 3 && A.dims == 1)
        {
            if (A.w * A.elempack == B.c * B.elempack)
                A2 = A.reshape(1, 1, A.w, opt.workspace_allocator);
            else // if (A.w == B.w)
            {
                A2.dims = 3;
                A2.w = A.w * A.elempack;
                A2.elempack = 1;
                A2.elemsize = A.elemsize / A.elempack;
                A2.cstep = A2.w;
            }
        }
        if (outdims == 3 && A.dims == 2)
            A2 = A.reshape(1, A.w, A.h, opt.workspace_allocator);
        if (outdims == 4 && A.dims == 1)
        {
            if (A.w * A.elempack == B.c * B.elempack)
                A2 = A.reshape(1, 1, 1, A.w, opt.workspace_allocator);
            else // if (A.w == B.w)
            {
                A2.dims = 4;
                A2.w = A.w * A.elempack;
                A2.elempack = 1;
                A2.elemsize = A.elemsize / A.elempack;
                A2.cstep = A2.w;
            }
        }
        if (outdims == 4 && A.dims == 2)
            A2 = A.reshape(1, 1, A.w, A.h, opt.workspace_allocator);
        if (outdims == 4 && A.dims == 3)
            A2 = A.reshape(1, A.w, A.h, A.c, opt.workspace_allocator);
    }
    if (B.dims < outdims)
    {
        // expand inner axes
        if (outdims == 2)
        {
            if (B.w * B.elempack == A.h * A.elempack)
                B2 = B.reshape(1, B.w, opt.workspace_allocator);
            else // if (B.w == A.w)
            {
                B2.dims = 2;
                B2.w = B.w * B.elempack;
                B2.elempack = 1;
                B2.elemsize = B.elemsize / B.elempack;
                B2.cstep = B2.w;
            }
        }
        if (outdims == 3 && B.dims == 1)
        {
            if (B.w * B.elempack == A.c * A.elempack)
                B2 = B.reshape(1, 1, B.w, opt.workspace_allocator);
            else // if (B.w == A.w)
            {
                B2.dims = 3;
                B2.w = B.w * B.elempack;
                B2.elempack = 1;
                B2.elemsize = B.elemsize / B.elempack;
                B2.cstep = B2.w;
            }
        }
        if (outdims == 3 && B.dims == 2)
            B2 = B.reshape(1, B.w, B.h, opt.workspace_allocator);
        if (outdims == 4 && B.dims == 1)
        {
            if (B.w * B.elempack == A.c * A.elempack)
                B2 = B.reshape(1, 1, 1, B.w, opt.workspace_allocator);
            else // if (B.w == A.w)
            {
                B2.dims = 4;
                B2.w = B.w * B.elempack;
                B2.elempack = 1;
                B2.elemsize = B.elemsize / B.elempack;
                B2.cstep = B2.w;
            }
        }
        if (outdims == 4 && B.dims == 2)
            B2 = B.reshape(1, 1, B.w, B.h, opt.workspace_allocator);
        if (outdims == 4 && B.dims == 3)
            B2 = B.reshape(1, B.w, B.h, B.c, opt.workspace_allocator);
    }

    const int outw = std::max(A2.w, B2.w);
    const int outh = std::max(A2.h, B2.h);
    const int outd = std::max(A2.d, B2.d);
    const int outc = std::max(A2.c, B2.c);
    const size_t out_elemsize = std::max(A2.elemsize, B2.elemsize);
    const int out_elempack = std::max(A2.elempack, B2.elempack);

    Mat& top_blob = top_blobs[0];
    if (outdims == 1)
    {
        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (outdims == 2)
    {
        top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (outdims == 3)
    {
        top_blob.create(outw, outh, outc, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (outdims == 4)
    {
        top_blob.create(outw, outh, outd, outc, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    const bool a_pack_is_lower = A2.elempack < B2.elempack;
    const bool a_pack_is_equal = A2.elempack == B2.elempack;
    const bool a_size_is_lower = A2.w * A2.h * A2.d * A2.c * A2.elempack < B2.w * B2.h * B2.d * B2.c * B2.elempack;
    if (a_pack_is_lower || (a_pack_is_equal && a_size_is_lower))
    {
        binary_op_broadcast(B2, A2, top_blob, get_reverse_op_type(op_type), opt);
    }
    else
    {
        binary_op_broadcast(A2, B2, top_blob, op_type, opt);
    }

    return 0;
}